

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

int __thiscall
AbstractModuleClient::processNotification
          (AbstractModuleClient *this,char *param_2,string *noteType,TrodesMsg *msg)

{
  bool bVar1;
  AbstractModuleClient *in_RDI;
  string who;
  string addr;
  binarydata configdata;
  TrodesConfig newConfig;
  int rc;
  binarydata *in_stack_fffffffffffffde8;
  TrodesConfig *in_stack_fffffffffffffdf0;
  TrodesConfig *in_stack_fffffffffffffdf8;
  allocator *paVar2;
  MlmWrap *in_stack_fffffffffffffe00;
  string local_1c0 [24];
  TrodesConfig *in_stack_fffffffffffffe58;
  TrodesConfig *in_stack_fffffffffffffe60;
  string local_198 [24];
  string *in_stack_fffffffffffffe80;
  MlmWrap *in_stack_fffffffffffffe88;
  network_pimpl *in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffe98;
  TrodesMsg *in_stack_fffffffffffffea0;
  allocator local_151;
  string local_150 [32];
  string local_130 [32];
  string local_110 [95];
  allocator local_b1;
  string local_b0 [16];
  string *in_stack_ffffffffffffff60;
  AbstractModuleClient *in_stack_ffffffffffffff68;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
  if (bVar1) {
    TrodesConfig::TrodesConfig(in_stack_fffffffffffffdf0);
    binarydata::binarydata((binarydata *)0x1c2ba0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"n",&local_b1);
    TrodesMsg::popcontents<binarydata>
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               (binarydata *)in_stack_fffffffffffffe90);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    TrodesConfig::decode(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    TrodesConfig::TrodesConfig(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    MlmWrap::setTrodesConfig(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    TrodesConfig::~TrodesConfig(in_stack_fffffffffffffdf0);
    binarydata::~binarydata((binarydata *)0x1c2c6e);
    TrodesConfig::~TrodesConfig(in_stack_fffffffffffffdf0);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
    if (bVar1) {
      TrodesMsg::popstr_abi_cxx11_((TrodesMsg *)in_RDI);
      bVar1 = subToTimestamps(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      if (!bVar1) {
        paVar2 = &local_151;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_150,"Could not properly register timestamps socket!\n",paVar2);
        MlmWrap::error(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
        std::operator<<((ostream *)&std::cerr,local_130);
        std::__cxx11::string::~string(local_130);
        std::__cxx11::string::~string(local_150);
        std::allocator<char>::~allocator((allocator<char> *)&local_151);
      }
      std::__cxx11::string::~string(local_110);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
      if (bVar1) {
        bVar1 = unsubToTimestamps(in_RDI);
        if (!bVar1) {
          paVar2 = (allocator *)&stack0xfffffffffffffe67;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_198,"Could not properly de-register timestamps socket!\n",paVar2);
          MlmWrap::error(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
          std::operator<<((ostream *)&std::cerr,(string *)&stack0xfffffffffffffe88);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffe88);
          std::__cxx11::string::~string(local_198);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe67);
        }
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
        if (bVar1) {
          TrodesMsg::popstr_abi_cxx11_((TrodesMsg *)in_RDI);
          network_pimpl::remove_client
                    (in_stack_fffffffffffffe90,(string *)in_stack_fffffffffffffe88);
          std::__cxx11::string::~string(local_1c0);
        }
      }
    }
  }
  return 0;
}

Assistant:

int AbstractModuleClient::processNotification(const char *, std::string noteType, TrodesMsg &msg) {
    int rc = 0;
//    std::cout << "AMC::processNotification: " << noteType << "\n";
    if (noteType == NOTE_CONFIG_CHANGED) {
        TrodesConfig newConfig;
        binarydata configdata;
        msg.popcontents("n", configdata);
        newConfig.decode(configdata);
        setTrodesConfig(newConfig);
    }
    else if(noteType == "TIMESTAMP_ADDRESS"){
        std::string addr = msg.popstr();
//        std::cout << "----address: |" << addr << "|\n";
        if(!subToTimestamps(addr)){
            std::cerr << error("Could not properly register timestamps socket!\n");
        }
    }
    else if(noteType == "TIMESTAMP_ADDRESS_DEREG"){
        //dereg timestamp
        if(!unsubToTimestamps()){
            std::cerr << error("Could not properly de-register timestamps socket!\n");
        }
    }
    else if(noteType == CLIENT_EXPIRED_MSG){
        auto const who = msg.popstr();
        state->remove_client(who);
    }
    // else{
    //     std::cout << "[AMC]: Notification type [" << noteType << "] not recognized.\n";
    // }
    return rc;
}